

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.cpp
# Opt level: O2

void __thiscall
rr::FragmentShadingContext::FragmentShadingContext
          (FragmentShadingContext *this,GenericVec4 *varying0,GenericVec4 *varying1,
          GenericVec4 *varying2,GenericVec4 *outputArray_,float *fragmentDepths_,int primitiveID_,
          int numFragmentOutputs_,int numSamples_,FaceType visibleFace_)

{
  int in_stack_00000008;
  
  this->outputArray = outputArray_;
  this->primitiveID = in_stack_00000008;
  this->numFragmentOutputs = primitiveID_;
  this->numSamples = numFragmentOutputs_;
  this->fragmentDepths = fragmentDepths_;
  this->visibleFace = numSamples_;
  this->varyings[0] = varying0;
  this->varyings[1] = varying1;
  this->varyings[2] = varying2;
  return;
}

Assistant:

FragmentShadingContext::FragmentShadingContext (const GenericVec4* varying0, const GenericVec4* varying1, const GenericVec4* varying2, GenericVec4* outputArray_, float* fragmentDepths_, int primitiveID_, int numFragmentOutputs_, int numSamples_, FaceType visibleFace_)
	: outputArray			(outputArray_)
	, primitiveID			(primitiveID_)
	, numFragmentOutputs	(numFragmentOutputs_)
	, numSamples			(numSamples_)
	, fragmentDepths		(fragmentDepths_)
	, visibleFace			(visibleFace_)
{
	varyings[0] = varying0;
	varyings[1] = varying1;
	varyings[2] = varying2;
}